

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall curlpp::LibcurlRuntimeError::~LibcurlRuntimeError(LibcurlRuntimeError *this)

{
  void *in_RDI;
  
  ~LibcurlRuntimeError((LibcurlRuntimeError *)0x1484b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

class CURLPPAPI LibcurlRuntimeError : public curlpp::RuntimeError
	{

	public:

		LibcurlRuntimeError(const std::string & reason, CURLcode code);
		LibcurlRuntimeError(const char * reason, CURLcode code);

		/**
		* Returns the CURLcode that libcurl returned.
		*/
		CURLcode whatCode() const throw();

	private:

		CURLcode mCode;

	}